

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_generator.cc
# Opt level: O1

void webrtc::WindowGenerator::KaiserBesselDerived(float alpha,size_t length,float *window)

{
  ulong uVar1;
  string *result;
  ostream *poVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  float fVar6;
  float extraout_XMM0_Db;
  undefined8 uVar7;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  size_t local_1c8;
  float local_1c0;
  float local_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  undefined8 local_1a8;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  FatalMessage local_198;
  
  local_198.stream_ = (ostringstream)0x1;
  local_198._1_3_ = 0;
  local_1c8 = length;
  local_1c0 = alpha;
  if (length < 2) {
    result = rtc::MakeCheckOpString<unsigned_long,unsigned_int>
                       (&local_1c8,(uint *)&local_198,"length > 1U");
  }
  else {
    result = (string *)0x0;
  }
  uVar1 = CONCAT44(local_1a8._4_4_,(float)local_1a8);
  if (result == (string *)0x0) {
    if (window != (float *)0x0) {
      local_1c0 = local_1c0 * 3.1415927;
      uVar5 = local_1c8 + 1 >> 1;
      lVar3 = 0;
      fVar9 = 0.0;
      do {
        fVar6 = ((float)lVar3 * 4.0) / (float)local_1c8 + -1.0;
        fVar8 = fVar6 * fVar6;
        local_1bc = fVar9;
        local_1a8 = uVar1;
        if ((NAN(fVar8)) && (NAN(fVar6 * 0.0 + fVar6 * 0.0))) {
          fVar8 = (float)__mulsc3(fVar6,0,fVar6,0);
        }
        fVar9 = csqrtf(1.0 - fVar8);
        fVar8 = (local_1c0 * fVar9) / 3.75;
        fVar10 = (extraout_XMM0_Db * local_1c0) / 3.75;
        uVar16 = 0;
        uVar17 = 0;
        fVar14 = fVar8 * fVar8 - fVar10 * fVar10;
        fVar9 = fVar10 * fVar8 + fVar10 * fVar8;
        fVar6 = extraout_XMM0_Db;
        uVar4 = (ulong)(uint)fVar14;
        uVar1 = local_1a8;
        if ((NAN(fVar14)) && (fVar6 = extraout_XMM0_Db, uVar4 = (ulong)(uint)fVar14, NAN(fVar9))) {
          uVar4 = __mulsc3(fVar8,fVar10,fVar8);
          fVar9 = (float)(uVar4 >> 0x20);
          fVar6 = fVar9;
          uVar16 = extraout_XMM0_Dc;
          uVar17 = extraout_XMM0_Dd;
          uVar1 = local_1a8;
        }
        fVar15 = (float)uVar4;
        fVar12 = fVar9 * 0.0045813;
        fVar14 = fVar15 * 0.0045813 + 0.0360768;
        fVar13 = fVar15 * fVar14 - fVar9 * fVar12;
        fVar11 = fVar9 * fVar14 + fVar15 * fVar12;
        fVar8 = fVar6;
        fVar10 = fVar6;
        uVar7 = CONCAT44(fVar11,fVar13);
        local_1a8 = uVar4;
        if ((NAN(fVar13)) && (uVar7 = CONCAT44(fVar11,fVar13), NAN(fVar11))) {
          local_1b8 = fVar9;
          fStack_1b4 = fVar6;
          fStack_1b0 = fVar6;
          fStack_1ac = fVar6;
          uStack_1a0 = uVar16;
          uStack_19c = uVar17;
          uVar7 = __mulsc3(fVar15,fVar9,fVar14,fVar12);
          fVar9 = local_1b8;
          fVar6 = fStack_1b4;
          fVar8 = fStack_1b0;
          fVar10 = fStack_1ac;
          uVar16 = uStack_1a0;
          uVar17 = uStack_19c;
          uVar1 = local_1a8;
        }
        fVar13 = (float)local_1a8;
        fVar14 = (float)((ulong)uVar7 >> 0x20);
        fVar12 = (float)uVar7 + 0.2659732;
        fVar11 = fVar13 * fVar12 - fVar9 * fVar14;
        fVar14 = fVar9 * fVar12 + fVar13 * fVar14;
        uVar7 = CONCAT44(fVar14,fVar11);
        if ((NAN(fVar11)) && (uVar7 = CONCAT44(fVar14,fVar11), NAN(fVar14))) {
          local_1b8 = fVar9;
          fStack_1b4 = fVar6;
          fStack_1b0 = fVar8;
          fStack_1ac = fVar10;
          uStack_1a0 = uVar16;
          uStack_19c = uVar17;
          uVar7 = __mulsc3(fVar13,fVar9,fVar12);
          fVar9 = local_1b8;
          fVar6 = fStack_1b4;
          fVar8 = fStack_1b0;
          fVar10 = fStack_1ac;
          uVar16 = uStack_1a0;
          uVar17 = uStack_19c;
          uVar1 = local_1a8;
        }
        fVar15 = (float)local_1a8;
        fVar13 = (float)((ulong)uVar7 >> 0x20);
        fVar12 = (float)uVar7 + 1.2067492;
        fVar14 = fVar15 * fVar12 - fVar9 * fVar13;
        fVar11 = fVar9 * fVar12 + fVar15 * fVar13;
        uVar7 = CONCAT44(fVar11,fVar14);
        if ((NAN(fVar14)) && (uVar7 = CONCAT44(fVar11,fVar14), NAN(fVar11))) {
          local_1b8 = fVar9;
          fStack_1b4 = fVar6;
          fStack_1b0 = fVar8;
          fStack_1ac = fVar10;
          uStack_1a0 = uVar16;
          uStack_19c = uVar17;
          uVar7 = __mulsc3(fVar15,fVar9,fVar12,fVar13);
          fVar9 = local_1b8;
          fVar6 = fStack_1b4;
          fVar8 = fStack_1b0;
          fVar10 = fStack_1ac;
          uVar16 = uStack_1a0;
          uVar17 = uStack_19c;
          uVar1 = local_1a8;
        }
        fVar11 = (float)((ulong)uVar7 >> 0x20);
        fVar14 = (float)uVar7 + 3.0899425;
        fVar12 = (float)local_1a8 * fVar14 - fVar9 * fVar11;
        fVar14 = fVar9 * fVar14 + (float)local_1a8 * fVar11;
        uVar7 = CONCAT44(fVar14,fVar12);
        if ((NAN(fVar12)) && (uVar7 = CONCAT44(fVar14,fVar12), NAN(fVar14))) {
          local_1b8 = fVar9;
          fStack_1b4 = fVar6;
          fStack_1b0 = fVar8;
          fStack_1ac = fVar10;
          uStack_1a0 = uVar16;
          uStack_19c = uVar17;
          uVar7 = __mulsc3((float)local_1a8);
          fVar9 = local_1b8;
          uVar1 = local_1a8;
        }
        fVar10 = (float)((ulong)uVar7 >> 0x20);
        fVar8 = (float)uVar7 + 3.5156229;
        fVar6 = (float)local_1a8 * fVar8 - fVar9 * fVar10;
        if ((NAN(fVar6)) && (NAN((float)local_1a8 * fVar10 + fVar9 * fVar8))) {
          fVar6 = (float)__mulsc3((float)local_1a8,fVar9,fVar8,fVar10);
          local_1a8 = uVar1;
          uVar1 = local_1a8;
        }
        fVar9 = local_1bc + fVar6 + 1.0;
        window[lVar3] = fVar9;
        lVar3 = lVar3 + 1;
      } while (uVar5 + 1 != lVar3);
      uVar4 = local_1c8 - 1;
      if (uVar5 <= uVar4) {
        lVar3 = -local_1c8;
        do {
          fVar6 = window[local_1c8 + lVar3] / fVar9;
          if (fVar6 < 0.0) {
            local_1bc = fVar9;
            local_1a8 = uVar1;
            fVar6 = sqrtf(fVar6);
            fVar9 = local_1bc;
            uVar1 = local_1a8;
          }
          else {
            fVar6 = SQRT(fVar6);
          }
          window[local_1c8 + lVar3] = fVar6;
          window[uVar4] = fVar6;
          uVar4 = uVar4 - 1;
          lVar3 = lVar3 + 1;
        } while (uVar5 <= uVar4);
      }
      if ((local_1c8 & 1) != 0) {
        fVar9 = window[uVar5 - 1] / fVar9;
        if (fVar9 < 0.0) {
          local_1a8 = uVar1;
          fVar9 = sqrtf(fVar9);
        }
        else {
          fVar9 = SQRT(fVar9);
        }
        window[uVar5 - 1] = fVar9;
      }
      return;
    }
    rtc::FatalMessage::FatalMessage
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/window_generator.cc"
               ,0x34);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198,"Check failed: window != nullptr",0x1f);
    std::ios::widen((char)(ostream *)&local_198 +
                    (char)*(undefined8 *)(CONCAT44(local_198._4_4_,local_198._0_4_) + -0x18));
    std::ostream::put((char)&local_198);
    poVar2 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"# ",2);
    rtc::FatalMessage::~FatalMessage(&local_198);
  }
  rtc::FatalMessage::FatalMessage
            (&local_198,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/window_generator.cc"
             ,0x33,result);
  rtc::FatalMessage::~FatalMessage(&local_198);
}

Assistant:

void WindowGenerator::KaiserBesselDerived(float alpha, size_t length,
                                          float* window) {
  RTC_CHECK_GT(length, 1U);
  RTC_CHECK(window != nullptr);

  const size_t half = (length + 1) / 2;
  float sum = 0.0f;

  for (size_t i = 0; i <= half; ++i) {
    complex<float> r = (4.0f * i) / length - 1.0f;
    sum += I0(static_cast<float>(M_PI) * alpha * sqrt(1.0f - r * r)).real();
    window[i] = sum;
  }
  for (size_t i = length - 1; i >= half; --i) {
    window[length - i - 1] = sqrtf(window[length - i - 1] / sum);
    window[i] = window[length - i - 1];
  }
  if (length % 2 == 1) {
    window[half - 1] = sqrtf(window[half - 1] / sum);
  }
}